

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

int __thiscall
jwt::verifier<jwt::default_clock>::verify(verifier<jwt::default_clock> *this,decoded_jwt *jwt)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  size_type sVar4;
  token_verification_exception *ptVar5;
  __shared_ptr_access<jwt::verifier<jwt::default_clock>::algo_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  size_t local_4f0;
  size_t local_480;
  size_t local_410;
  allocator<char> local_389;
  string local_388;
  reference local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  iterator __end5;
  iterator __begin5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aud;
  string local_2e0;
  reference local_2c0;
  value_type *c;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
  *__range2;
  string local_298;
  duration<long,_std::ratio<1L,_1L>_> local_278;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_270;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_268;
  date nbf;
  key_type local_258;
  time_point local_238;
  allocator<char> local_229;
  key_type local_228;
  size_t local_208;
  size_t leeway_2;
  string local_1f8;
  duration<long,_std::ratio<1L,_1L>_> local_1d8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1d0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_1c8;
  date iat;
  key_type local_1b8;
  time_point local_198;
  allocator<char> local_189;
  key_type local_188;
  size_t local_168;
  size_t leeway_1;
  string local_158;
  duration<long,_std::ratio<1L,_1L>_> local_138;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_130;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_128;
  date exp;
  key_type local_118;
  time_point local_f8;
  allocator<char> local_e9;
  key_type local_e8;
  size_t local_c8;
  size_t leeway;
  time_point time;
  undefined1 local_b0 [5];
  anon_class_1_0_00000001 assert_claim_eq;
  string *algo;
  string sig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string data;
  decoded_jwt *jwt_local;
  verifier<jwt::default_clock> *this_local;
  
  data.field_2._8_8_ = jwt;
  psVar3 = decoded_jwt::get_header_base64_abi_cxx11_(jwt);
  std::operator+(&local_58,psVar3,".");
  psVar3 = decoded_jwt::get_payload_base64_abi_cxx11_((decoded_jwt *)data.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,psVar3);
  std::__cxx11::string::~string((string *)&local_58);
  psVar3 = decoded_jwt::get_signature_abi_cxx11_((decoded_jwt *)data.field_2._8_8_);
  std::__cxx11::string::string((string *)&algo,(string *)psVar3);
  psVar3 = header::get_algorithm_abi_cxx11_((header *)data.field_2._8_8_);
  sVar4 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
          ::count(&this->algs,psVar3);
  if (sVar4 == 0) {
    time.__d.__r._6_1_ = 1;
    ptVar5 = (token_verification_exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"wrong algorithm",(allocator<char> *)((long)&time.__d.__r + 7));
    token_verification_exception::token_verification_exception(ptVar5,(string *)local_b0);
    time.__d.__r._6_1_ = 0;
    __cxa_throw(ptVar5,&token_verification_exception::typeinfo,
                token_verification_exception::~token_verification_exception);
  }
  this_00 = (__shared_ptr_access<jwt::verifier<jwt::default_clock>::algo_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jwt::verifier<jwt::default_clock>::algo_base>_>_>_>
               ::at(&this->algs,psVar3);
  peVar6 = std::
           __shared_ptr_access<jwt::verifier<jwt::default_clock>::algo_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(this_00);
  (*peVar6->_vptr_algo_base[2])(peVar6,local_38,&algo);
  leeway = (size_t)default_clock::now((default_clock *)&this->field_0x40);
  bVar1 = payload::has_expires_at((payload *)(data.field_2._8_8_ + 0x38));
  if (bVar1) {
    std::allocator<char>::allocator();
    exp.__d.__r._6_1_ = 0;
    exp.__d.__r._5_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"exp",&local_e9);
    sVar7 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
            ::count(&this->claims,&local_e8);
    if (sVar7 == 1) {
      std::allocator<char>::allocator();
      exp.__d.__r._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"exp",(allocator<char> *)((long)&exp.__d.__r + 7));
      exp.__d.__r._5_1_ = 1;
      pmVar8 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
               ::at(&this->claims,&local_118);
      local_f8.__d.__r = (duration)claim::as_date(pmVar8);
      local_410 = std::chrono::_V2::system_clock::to_time_t(&local_f8);
    }
    else {
      local_410 = this->default_leeway;
    }
    if ((exp.__d.__r._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_118);
    }
    if ((exp.__d.__r._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&exp.__d.__r + 7));
    }
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    local_c8 = local_410;
    local_128.__d.__r = (duration)payload::get_expires_at((payload *)(data.field_2._8_8_ + 0x38));
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_138,&local_c8);
    local_130 = std::chrono::operator+(&local_128,&local_138);
    bVar1 = std::chrono::operator>
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&leeway,&local_130);
    if (bVar1) {
      leeway_1._6_1_ = 1;
      ptVar5 = (token_verification_exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"token expired",(allocator<char> *)((long)&leeway_1 + 7));
      token_verification_exception::token_verification_exception(ptVar5,&local_158);
      leeway_1._6_1_ = 0;
      __cxa_throw(ptVar5,&token_verification_exception::typeinfo,
                  token_verification_exception::~token_verification_exception);
    }
  }
  bVar1 = payload::has_issued_at((payload *)(data.field_2._8_8_ + 0x38));
  if (bVar1) {
    std::allocator<char>::allocator();
    iat.__d.__r._6_1_ = 0;
    iat.__d.__r._5_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"iat",&local_189);
    sVar7 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
            ::count(&this->claims,&local_188);
    if (sVar7 == 1) {
      std::allocator<char>::allocator();
      iat.__d.__r._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"iat",(allocator<char> *)((long)&iat.__d.__r + 7));
      iat.__d.__r._5_1_ = 1;
      pmVar8 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
               ::at(&this->claims,&local_1b8);
      local_198.__d.__r = (duration)claim::as_date(pmVar8);
      local_480 = std::chrono::_V2::system_clock::to_time_t(&local_198);
    }
    else {
      local_480 = this->default_leeway;
    }
    if ((iat.__d.__r._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    if ((iat.__d.__r._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&iat.__d.__r + 7));
    }
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    local_168 = local_480;
    local_1c8.__d.__r = (duration)payload::get_issued_at((payload *)(data.field_2._8_8_ + 0x38));
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_1d8,&local_168);
    local_1d0 = std::chrono::operator-(&local_1c8,&local_1d8);
    bVar1 = std::chrono::operator<
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&leeway,&local_1d0);
    if (bVar1) {
      leeway_2._6_1_ = 1;
      ptVar5 = (token_verification_exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"token expired",(allocator<char> *)((long)&leeway_2 + 7));
      token_verification_exception::token_verification_exception(ptVar5,&local_1f8);
      leeway_2._6_1_ = 0;
      __cxa_throw(ptVar5,&token_verification_exception::typeinfo,
                  token_verification_exception::~token_verification_exception);
    }
  }
  bVar1 = payload::has_not_before((payload *)(data.field_2._8_8_ + 0x38));
  if (bVar1) {
    std::allocator<char>::allocator();
    nbf.__d.__r._6_1_ = 0;
    nbf.__d.__r._5_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"nbf",&local_229);
    sVar7 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
            ::count(&this->claims,&local_228);
    if (sVar7 == 1) {
      std::allocator<char>::allocator();
      nbf.__d.__r._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"nbf",(allocator<char> *)((long)&nbf.__d.__r + 7));
      nbf.__d.__r._5_1_ = 1;
      pmVar8 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
               ::at(&this->claims,&local_258);
      local_238.__d.__r = (duration)claim::as_date(pmVar8);
      local_4f0 = std::chrono::_V2::system_clock::to_time_t(&local_238);
    }
    else {
      local_4f0 = this->default_leeway;
    }
    if ((nbf.__d.__r._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_258);
    }
    if ((nbf.__d.__r._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&nbf.__d.__r + 7));
    }
    std::__cxx11::string::~string((string *)&local_228);
    std::allocator<char>::~allocator(&local_229);
    local_208 = local_4f0;
    local_268.__d.__r = (duration)payload::get_not_before((payload *)(data.field_2._8_8_ + 0x38));
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_278,&local_208);
    local_270 = std::chrono::operator-(&local_268,&local_278);
    bVar1 = std::chrono::operator<
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&leeway,&local_270);
    if (bVar1) {
      __range2._6_1_ = 1;
      ptVar5 = (token_verification_exception *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"token expired",(allocator<char> *)((long)&__range2 + 7));
      token_verification_exception::token_verification_exception(ptVar5,&local_298);
      __range2._6_1_ = 0;
      __cxa_throw(ptVar5,&token_verification_exception::typeinfo,
                  token_verification_exception::~token_verification_exception);
    }
  }
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
           ::begin(&this->claims);
  c = (value_type *)
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>_>_>
      ::end(&this->claims);
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_true>
                         *)&c);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&algo);
      iVar2 = std::__cxx11::string::~string((string *)local_38);
      return iVar2;
    }
    local_2c0 = std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_false,_true>
                ::operator*(&__end2);
    bVar1 = std::operator==(&local_2c0->first,"exp");
    if (((!bVar1) && (bVar1 = std::operator==(&local_2c0->first,"iat"), !bVar1)) &&
       (bVar1 = std::operator==(&local_2c0->first,"nbf"), !bVar1)) {
      bVar1 = std::operator==(&local_2c0->first,"aud");
      if (bVar1) {
        bVar1 = payload::has_audience((payload *)(data.field_2._8_8_ + 0x38));
        if (!bVar1) {
          aud._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
          ptVar5 = (token_verification_exception *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e0,"token doesn\'t contain the required audience",
                     (allocator<char> *)
                     ((long)&aud._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
          token_verification_exception::token_verification_exception(ptVar5,&local_2e0);
          aud._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
          __cxa_throw(ptVar5,&token_verification_exception::typeinfo,
                      token_verification_exception::~token_verification_exception);
        }
        payload::get_audience_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (payload *)(data.field_2._8_8_ + 0x38));
        claim::as_set_abi_cxx11_
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range5,&local_2c0->second);
        __end5 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range5);
        e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range5);
        while (bVar1 = std::operator!=(&__end5,(_Self *)&e), bVar1) {
          local_368 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end5);
          sVar9 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count,local_368);
          if (sVar9 == 0) {
            ptVar5 = (token_verification_exception *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_388,"token doesn\'t contain the required audience",
                       &local_389);
            token_verification_exception::token_verification_exception(ptVar5,&local_388);
            __cxa_throw(ptVar5,&token_verification_exception::typeinfo,
                        token_verification_exception::~token_verification_exception);
          }
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end5);
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range5);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&expected._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      else {
        verify::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&time.__d.__r + 5),
                   (decoded_jwt *)data.field_2._8_8_,&local_2c0->first,&local_2c0->second);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jwt::claim>,_false,_true>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void verify(const decoded_jwt& jwt) const {
			const std::string data = jwt.get_header_base64() + "." + jwt.get_payload_base64();
			const std::string sig = jwt.get_signature();
			const std::string& algo = jwt.get_algorithm();
			if (algs.count(algo) == 0)
				throw token_verification_exception("wrong algorithm");
			algs.at(algo)->verify(data, sig);

			auto assert_claim_eq = [](const decoded_jwt& jwt, const std::string& key, const claim& c) {
				if (!jwt.has_payload_claim(key))
					throw token_verification_exception("decoded_jwt is missing " + key + " claim");
				auto& jc = jwt.get_payload_claim(key);
				if (jc.get_type() != c.get_type())
					throw token_verification_exception("claim " + key + " type mismatch");
				if (c.get_type() == claim::type::int64) {
					if (c.as_date() != jc.as_date())
						throw token_verification_exception("claim " + key + " does not match expected");
				}
				else if (c.get_type() == claim::type::array) {
					auto s1 = c.as_set();
					auto s2 = jc.as_set();
					if (s1.size() != s2.size())
						throw token_verification_exception("claim " + key + " does not match expected");
					auto it1 = s1.cbegin();
					auto it2 = s2.cbegin();
					while (it1 != s1.cend() && it2 != s2.cend()) {
						if (*it1++ != *it2++)
							throw token_verification_exception("claim " + key + " does not match expected");
					}
				}
				else if (c.get_type() == claim::type::object) {
					if( c.to_json().serialize() != jc.to_json().serialize())
						throw token_verification_exception("claim " + key + " does not match expected");
				}
				else if (c.get_type() == claim::type::string) {
					if (c.as_string() != jc.as_string())
						throw token_verification_exception("claim " + key + " does not match expected");
				}
				else throw token_verification_exception("internal error");
			};

			auto time = clock.now();

			if (jwt.has_expires_at()) {
				auto leeway = claims.count("exp") == 1 ? std::chrono::system_clock::to_time_t(claims.at("exp").as_date()) : default_leeway;
				auto exp = jwt.get_expires_at();
				if (time > exp + std::chrono::seconds(leeway))
					throw token_verification_exception("token expired");
			}
			if (jwt.has_issued_at()) {
				auto leeway = claims.count("iat") == 1 ? std::chrono::system_clock::to_time_t(claims.at("iat").as_date()) : default_leeway;
				auto iat = jwt.get_issued_at();
				if (time < iat - std::chrono::seconds(leeway))
					throw token_verification_exception("token expired");
			}
			if (jwt.has_not_before()) {
				auto leeway = claims.count("nbf") == 1 ? std::chrono::system_clock::to_time_t(claims.at("nbf").as_date()) : default_leeway;
				auto nbf = jwt.get_not_before();
				if (time < nbf - std::chrono::seconds(leeway))
					throw token_verification_exception("token expired");
			}
			for (auto& c : claims)
			{
				if (c.first == "exp" || c.first == "iat" || c.first == "nbf") {
					// Nothing to do here, already checked
				}
				else if (c.first == "aud") {
					if (!jwt.has_audience())
						throw token_verification_exception("token doesn't contain the required audience");
					auto aud = jwt.get_audience();
					auto expected = c.second.as_set();
					for (auto& e : expected)
						if (aud.count(e) == 0)
							throw token_verification_exception("token doesn't contain the required audience");
				}
				else {
					assert_claim_eq(jwt, c.first, c.second);
				}
			}
		}